

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ConvertEntropyToMnemonicRequest::ConvertEntropyToMnemonicRequest
          (ConvertEntropyToMnemonicRequest *this)

{
  allocator local_25 [20];
  allocator local_11;
  ConvertEntropyToMnemonicRequest *local_10;
  ConvertEntropyToMnemonicRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::ConvertEntropyToMnemonicRequest>).
  _vptr_JsonClassBase = (_func_int **)&PTR__ConvertEntropyToMnemonicRequest_01b3b450;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->entropy_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->language_,"en",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  CollectFieldName();
  return;
}

Assistant:

ConvertEntropyToMnemonicRequest() {
    CollectFieldName();
  }